

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

int __thiscall google::protobuf::ServiceOptions::ByteSize(ServiceOptions *this)

{
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  uint value;
  int iVar2;
  int iVar3;
  long lVar4;
  
  iVar2 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  iVar3 = iVar2 * 2;
  if (0 < iVar2) {
    lVar4 = 0;
    do {
      value = UninterpretedOption::ByteSize
                        ((UninterpretedOption *)
                         (this->uninterpreted_option_).super_RepeatedPtrFieldBase.elements_[lVar4]);
      iVar2 = 1;
      if (0x7f < value) {
        iVar2 = io::CodedOutputStream::VarintSize32Fallback(value);
      }
      iVar3 = iVar3 + value + iVar2;
      lVar4 = lVar4 + 1;
    } while (lVar4 < (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar2 = internal::ExtensionSet::ByteSize(&this->_extensions_);
  iVar2 = iVar2 + iVar3;
  pvVar1 = (this->_unknown_fields_).fields_;
  if ((pvVar1 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    iVar3 = internal::WireFormat::ComputeUnknownFieldsSize(&this->_unknown_fields_);
    iVar2 = iVar2 + iVar3;
  }
  this->_cached_size_ = iVar2;
  return iVar2;
}

Assistant:

int ServiceOptions::ByteSize() const {
  int total_size = 0;

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  total_size += 2 * this->uninterpreted_option_size();
  for (int i = 0; i < this->uninterpreted_option_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->uninterpreted_option(i));
  }

  total_size += _extensions_.ByteSize();

  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}